

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O0

void __thiscall
pbrt::InstanceSceneEntity::InstanceSceneEntity
          (InstanceSceneEntity *this,string *name,FileLoc loc,
          AnimatedTransform *renderFromInstanceAnim,Transform *renderFromInstance)

{
  undefined1 auVar1 [64];
  FileLoc loc_00;
  ParsedParameter *in_RCX;
  void *in_RDX;
  string *in_RSI;
  ParameterDictionary *in_RDI;
  char *in_stack_00000008;
  undefined4 uStack0000000000000010;
  undefined4 uStack0000000000000014;
  ParameterDictionary *in_stack_ffffffffffffff10;
  SceneEntity *this_00;
  size_t in_stack_ffffffffffffff50;
  undefined1 local_88 [40];
  undefined1 local_60 [24];
  undefined1 auStack_48 [40];
  undefined8 local_20;
  void *local_18;
  
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  auStack_48 = auVar1._24_40_;
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_88 = auVar1._0_40_;
  local_60 = auVar1._40_24_;
  this_00 = (SceneEntity *)local_88;
  local_20 = in_RCX;
  local_18 = in_RDX;
  ParameterDictionary::ParameterDictionary(in_stack_ffffffffffffff10);
  loc_00.filename._M_str = in_stack_00000008;
  loc_00.filename._M_len = in_stack_ffffffffffffff50;
  loc_00.line = uStack0000000000000010;
  loc_00.column = uStack0000000000000014;
  SceneEntity::SceneEntity(this_00,in_RSI,in_RDI,loc_00);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x9e32e8);
  memcpy((void *)((long)&in_RDI[1].params.field_2 + 0x28),local_18,0x2b8);
  in_RDI[8].params.field_2.fixed[1] = (ParsedParameter *)local_20;
  return;
}

Assistant:

InstanceSceneEntity(const std::string &name, FileLoc loc,
                        const AnimatedTransform &renderFromInstanceAnim,
                        const Transform *renderFromInstance)
        : SceneEntity(name, {}, loc),
          renderFromInstanceAnim(renderFromInstanceAnim),
          renderFromInstance(renderFromInstance) {}